

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O2

void __thiscall binpac::FlowBuffer::MarkOrCopyFrame(FlowBuffer *this)

{
  int iVar1;
  int iVar2;
  const_byteptr puVar3;
  int len;
  
  if (((this->mode_ == FRAME_MODE) && (this->state_ == CR_OR_LF_1)) &&
     (puVar3 = this->orig_data_begin_, puVar3 < this->orig_data_end_)) {
    if (*puVar3 == '\n') {
      this->orig_data_begin_ = puVar3 + 1;
    }
    this->state_ = FRAME_0;
  }
  iVar1 = this->buffer_n_;
  if (iVar1 != 0) {
    len = *(int *)&this->orig_data_end_ - (int)this->orig_data_begin_;
    this->message_complete_ = false;
    iVar2 = this->frame_length_;
    if ((-1 < iVar2) && (iVar2 <= iVar1 + len)) {
      len = iVar2 - iVar1;
      this->message_complete_ = true;
    }
    AppendToBuffer(this,this->orig_data_begin_,len);
    return;
  }
  if (((long)this->frame_length_ < 0) ||
     ((long)this->orig_data_end_ - (long)this->orig_data_begin_ < (long)this->frame_length_)) {
    if (this->chunked_ == false) {
      AppendToBuffer(this,this->orig_data_begin_,
                     *(int *)&this->orig_data_end_ - (int)this->orig_data_begin_);
    }
    this->message_complete_ = false;
  }
  else {
    this->message_complete_ = true;
  }
  return;
}

Assistant:

void FlowBuffer::MarkOrCopyFrame()
	{
	if ( mode_ == FRAME_MODE && state_ == CR_OR_LF_1 && orig_data_begin_ < orig_data_end_ )
		{
		// Skip the lingering LF
		if ( *orig_data_begin_ == LF )
			{
			++orig_data_begin_;
			}
		state_ = FRAME_0;
		}

	if ( buffer_n_ == 0 )
		{
		// If there is enough data
		if ( frame_length_ >= 0 && orig_data_end_ - orig_data_begin_ >= frame_length_ )
			{
			// Do nothing except setting the message complete flag
			message_complete_ = true;
			}
		else
			{
			if ( ! chunked_ )
				{
				AppendToBuffer(orig_data_begin_, orig_data_end_ - orig_data_begin_);
				}
			message_complete_ = false;
			}
		}
	else
		{
		BINPAC_ASSERT(! chunked_);
		int bytes_to_copy = orig_data_end_ - orig_data_begin_;
		message_complete_ = false;
		if ( frame_length_ >= 0 && buffer_n_ + bytes_to_copy >= frame_length_ )
			{
			bytes_to_copy = frame_length_ - buffer_n_;
			message_complete_ = true;
			}
		AppendToBuffer(orig_data_begin_, bytes_to_copy);
		}

#if DEBUG_FLOW_BUFFER
	if ( message_complete_ )
		{
		fprintf(stderr, "%.6f frame complete: [%s]\n", network_time(),
		        string((const char*)begin(), (const char*)end()).c_str());
		}
#endif
	}